

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtouchhandler.cpp
# Opt level: O0

void __thiscall QEvdevTouchScreenData::assignIds(QEvdevTouchScreenData *this)

{
  const_iterator it_00;
  bool bVar1;
  int iVar2;
  Contact *pCVar3;
  QHash<int,_QEvdevTouchScreenData::Contact> *in_RDI;
  long in_FS_OFFSET;
  iterator iVar4;
  int id;
  int bestDist;
  int maxId;
  int dist;
  int bestId;
  iterator bestMatch;
  iterator ite;
  iterator it;
  QHash<int,_QEvdevTouchScreenData::Contact> newContacts;
  QHash<int,_QEvdevTouchScreenData::Contact> pending;
  QHash<int,_QEvdevTouchScreenData::Contact> candidates;
  QHash<int,_QEvdevTouchScreenData::Contact> *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  Contact *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  int in_stack_fffffffffffffef8;
  uint in_stack_fffffffffffffefc;
  undefined1 in_stack_ffffffffffffff08 [16];
  int iVar5;
  int iVar6;
  QHash<int,_QEvdevTouchScreenData::Contact> *pQVar7;
  Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *local_b0;
  size_t local_a8;
  Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *local_a0;
  size_t local_98;
  const_iterator local_90;
  int local_7c;
  piter local_78;
  piter local_68;
  int local_54;
  iterator local_50;
  Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *local_40;
  size_t local_38;
  Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *local_30;
  size_t local_28;
  QHash<int,_QEvdevTouchScreenData::Contact> local_20;
  QHash<int,_QEvdevTouchScreenData::Contact> local_18;
  QHash<int,_QEvdevTouchScreenData::Contact> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.d = (Data *)0xaaaaaaaaaaaaaaaa;
  pQVar7 = in_RDI;
  QHash<int,_QEvdevTouchScreenData::Contact>::QHash
            ((QHash<int,_QEvdevTouchScreenData::Contact> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),in_stack_fffffffffffffed8
            );
  local_18.d = (Data *)0xaaaaaaaaaaaaaaaa;
  QHash<int,_QEvdevTouchScreenData::Contact>::QHash
            ((QHash<int,_QEvdevTouchScreenData::Contact> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),in_stack_fffffffffffffed8
            );
  local_20.d = (Data *)0xaaaaaaaaaaaaaaaa;
  QHash<int,_QEvdevTouchScreenData::Contact>::QHash(&local_20);
  iVar6 = -1;
  local_30 = (Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *)0xaaaaaaaaaaaaaaaa;
  local_28 = 0xaaaaaaaaaaaaaaaa;
  QHash<int,_QEvdevTouchScreenData::Contact>::iterator::iterator((iterator *)0x14e0cf);
  local_40 = (Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *)0xaaaaaaaaaaaaaaaa;
  local_38 = 0xaaaaaaaaaaaaaaaa;
  QHash<int,_QEvdevTouchScreenData::Contact>::iterator::iterator((iterator *)0x14e0fa);
  local_50.i.d = (Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *)
                 0xaaaaaaaaaaaaaaaa;
  local_50.i.bucket = 0xaaaaaaaaaaaaaaaa;
  QHash<int,_QEvdevTouchScreenData::Contact>::iterator::iterator((iterator *)0x14e125);
  while( true ) {
    bVar1 = QHash<int,_QEvdevTouchScreenData::Contact>::isEmpty(&local_18);
    in_stack_fffffffffffffefc = in_stack_fffffffffffffefc & 0xffffff;
    if (!bVar1) {
      bVar1 = QHash<int,_QEvdevTouchScreenData::Contact>::isEmpty(&local_10);
      in_stack_fffffffffffffefc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffefc) ^ 0xff000000;
    }
    if ((in_stack_fffffffffffffefc & 0x1000000) == 0) break;
    iVar5 = -1;
    local_54 = 0;
    local_68 = (piter)QHash<int,_QEvdevTouchScreenData::Contact>::begin
                                ((QHash<int,_QEvdevTouchScreenData::Contact> *)
                                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    local_30 = local_68.d;
    local_28 = local_68.bucket;
    local_78 = (piter)QHash<int,_QEvdevTouchScreenData::Contact>::end
                                ((QHash<int,_QEvdevTouchScreenData::Contact> *)
                                 in_stack_fffffffffffffee8);
    local_40 = local_78.d;
    local_38 = local_78.bucket;
    while (bVar1 = QHash<int,_QEvdevTouchScreenData::Contact>::iterator::operator!=
                             ((iterator *)in_stack_fffffffffffffee8,
                              (iterator *)
                              CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)), bVar1)
    {
      local_7c = -0x55555556;
      pCVar3 = QHash<int,_QEvdevTouchScreenData::Contact>::iterator::operator->
                         ((iterator *)0x14e222);
      in_stack_fffffffffffffef8 = pCVar3->x;
      QHash<int,_QEvdevTouchScreenData::Contact>::iterator::operator->((iterator *)0x14e236);
      iVar2 = findClosestContact(in_stack_ffffffffffffff08._0_8_,in_RDI,in_stack_fffffffffffffefc,
                                 in_stack_fffffffffffffef8,
                                 (int *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0
                                                ));
      if ((-1 < iVar2) && ((iVar5 == -1 || (local_7c < iVar5)))) {
        local_50.i.d = local_30;
        local_50.i.bucket = local_28;
        iVar5 = local_7c;
        local_54 = iVar2;
      }
      QHash<int,_QEvdevTouchScreenData::Contact>::iterator::operator++
                ((iterator *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    }
    if (-1 < iVar5) {
      in_stack_fffffffffffffef4 = local_54;
      pCVar3 = QHash<int,_QEvdevTouchScreenData::Contact>::iterator::operator->
                         ((iterator *)0x14e2e3);
      pCVar3->trackingId = in_stack_fffffffffffffef4;
      QHash<int,_QEvdevTouchScreenData::Contact>::iterator::operator*((iterator *)0x14e2f6);
      QHash<int,_QEvdevTouchScreenData::Contact>::insert
                ((QHash<int,_QEvdevTouchScreenData::Contact> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (int *)in_stack_fffffffffffffed8,(Contact *)0x14e30e);
      QHash<int,_QEvdevTouchScreenData::Contact>::remove(&local_10,(char *)&local_54);
      QHash<int,_QEvdevTouchScreenData::Contact>::const_iterator::const_iterator
                (&local_90,&local_50);
      it_00.i.d._4_4_ = iVar6;
      it_00.i.d._0_4_ = iVar5;
      it_00.i.bucket = (size_t)pQVar7;
      QHash<int,_QEvdevTouchScreenData::Contact>::erase
                ((QHash<int,_QEvdevTouchScreenData::Contact> *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),it_00);
      if (iVar6 < local_54) {
        iVar6 = local_54;
      }
    }
  }
  bVar1 = QHash<int,_QEvdevTouchScreenData::Contact>::isEmpty(&local_10);
  if (bVar1) {
    iVar4 = QHash<int,_QEvdevTouchScreenData::Contact>::begin
                      ((QHash<int,_QEvdevTouchScreenData::Contact> *)
                       CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    local_a0 = iVar4.i.d;
    local_30 = local_a0;
    local_98 = iVar4.i.bucket;
    local_28 = local_98;
    iVar4 = QHash<int,_QEvdevTouchScreenData::Contact>::end
                      ((QHash<int,_QEvdevTouchScreenData::Contact> *)in_stack_fffffffffffffee8);
    local_b0 = iVar4.i.d;
    local_40 = local_b0;
    local_a8 = iVar4.i.bucket;
    local_38 = local_a8;
    while (bVar1 = QHash<int,_QEvdevTouchScreenData::Contact>::iterator::operator!=
                             ((iterator *)in_stack_fffffffffffffee8,
                              (iterator *)
                              CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)), bVar1)
    {
      in_stack_fffffffffffffee4 = iVar6 + 1;
      iVar6 = in_stack_fffffffffffffee4;
      pCVar3 = QHash<int,_QEvdevTouchScreenData::Contact>::iterator::operator->
                         ((iterator *)0x14e449);
      pCVar3->trackingId = in_stack_fffffffffffffee4;
      in_stack_fffffffffffffee8 =
           QHash<int,_QEvdevTouchScreenData::Contact>::iterator::operator->((iterator *)0x14e45c);
      QHash<int,_QEvdevTouchScreenData::Contact>::iterator::operator*((iterator *)0x14e46e);
      QHash<int,_QEvdevTouchScreenData::Contact>::insert
                ((QHash<int,_QEvdevTouchScreenData::Contact> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (int *)in_stack_fffffffffffffed8,(Contact *)0x14e483);
      QHash<int,_QEvdevTouchScreenData::Contact>::iterator::operator++
                ((iterator *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    }
  }
  QHash<int,_QEvdevTouchScreenData::Contact>::operator=
            ((QHash<int,_QEvdevTouchScreenData::Contact> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             (QHash<int,_QEvdevTouchScreenData::Contact> *)in_stack_fffffffffffffee8);
  QHash<int,_QEvdevTouchScreenData::Contact>::~QHash
            ((QHash<int,_QEvdevTouchScreenData::Contact> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  QHash<int,_QEvdevTouchScreenData::Contact>::~QHash
            ((QHash<int,_QEvdevTouchScreenData::Contact> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  QHash<int,_QEvdevTouchScreenData::Contact>::~QHash
            ((QHash<int,_QEvdevTouchScreenData::Contact> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEvdevTouchScreenData::assignIds()
{
    QHash<int, Contact> candidates = m_lastContacts, pending = m_contacts, newContacts;
    int maxId = -1;
    QHash<int, Contact>::iterator it, ite, bestMatch;
    while (!pending.isEmpty() && !candidates.isEmpty()) {
        int bestDist = -1, bestId = 0;
        for (it = pending.begin(), ite = pending.end(); it != ite; ++it) {
            int dist;
            int id = findClosestContact(candidates, it->x, it->y, &dist);
            if (id >= 0 && (bestDist == -1 || dist < bestDist)) {
                bestDist = dist;
                bestId = id;
                bestMatch = it;
            }
        }
        if (bestDist >= 0) {
            bestMatch->trackingId = bestId;
            newContacts.insert(bestId, *bestMatch);
            candidates.remove(bestId);
            pending.erase(bestMatch);
            if (bestId > maxId)
                maxId = bestId;
        }
    }
    if (candidates.isEmpty()) {
        for (it = pending.begin(), ite = pending.end(); it != ite; ++it) {
            it->trackingId = ++maxId;
            newContacts.insert(it->trackingId, *it);
        }
    }
    m_contacts = newContacts;
}